

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void * stb__arr_copy_(void *p,int elem_size)

{
  void *pvVar1;
  
  if (p == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = stb__arr_malloc(*(int *)((long)p + -0xc) * elem_size + 0x10);
    memcpy(pvVar1,(void *)((long)p + -0x10),(long)elem_size * (long)*(int *)((long)p + -0x10) + 0x10
          );
    *(uint *)((long)pvVar1 + 8) = (uint)(stb__arr_context != (void *)0x0);
    pvVar1 = (void *)((long)pvVar1 + 0x10);
  }
  return pvVar1;
}

Assistant:

void * stb__arr_copy_(void *p, int elem_size)
{
   stb__arr *q;
   if (p == NULL) return p;
   q = (stb__arr *) stb__arr_malloc(sizeof(*q) + elem_size * stb_arrhead2(p)->limit);
   stb_arr_check2(p);
   memcpy(q, stb_arrhead2(p), sizeof(*q) + elem_size * stb_arrhead2(p)->len);
   q->stb_malloc = !!stb__arr_context;
   return q+1;
}